

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportmqtt.c
# Opt level: O2

XIO_HANDLE
getIoTransportProvider
          (char *fully_qualified_name,MQTT_TRANSPORT_PROXY_OPTIONS *mqtt_transport_proxy_options)

{
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE pXVar1;
  LOGGER_LOG p_Var2;
  char *local_30;
  undefined4 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  io_interface_description = platform_get_default_tlsio();
  if (io_interface_description == (IO_INTERFACE_DESCRIPTION *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pXVar1 = (XIO_HANDLE)0x0;
    }
    else {
      pXVar1 = (XIO_HANDLE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportmqtt.c"
                ,"getIoTransportProvider",0x15,1,"Failure constructing the provider interface");
    }
  }
  else {
    local_28 = 0x22b3;
    local_20 = 0;
    uStack_18 = 0;
    local_30 = fully_qualified_name;
    pXVar1 = xio_create(io_interface_description,&local_30);
  }
  return pXVar1;
}

Assistant:

static XIO_HANDLE getIoTransportProvider(const char* fully_qualified_name, const MQTT_TRANSPORT_PROXY_OPTIONS* mqtt_transport_proxy_options)
{
    XIO_HANDLE result;

    const IO_INTERFACE_DESCRIPTION* io_interface_description = platform_get_default_tlsio();
    (void)mqtt_transport_proxy_options;

    if (io_interface_description == NULL)
    {
        LogError("Failure constructing the provider interface");
        result = NULL;
    }
    else
    {
        TLSIO_CONFIG tls_io_config;

        tls_io_config.hostname = fully_qualified_name;
        tls_io_config.port = 8883;
        tls_io_config.underlying_io_interface = NULL;
        tls_io_config.underlying_io_parameters = NULL;

        result = xio_create(io_interface_description, &tls_io_config);
    }
    return result;
}